

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>
::visit_half(json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>
             *this,uint16_t value,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  structure_type sVar1;
  undefined8 uVar2;
  semantic_tag local_23;
  uint16_t local_22;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_5
  local_20;
  
  uVar2 = local_20._0_8_;
  sVar1 = (this->structure_stack_).
          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>::structure_info>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type_;
  local_23 = tag;
  local_22 = value;
  if (sVar1 - array_t < 2) {
    local_20._0_8_ = this->index_;
    this->index_ = local_20._0_8_ + 1;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,unsigned_long,jsoncons::half_arg_t_const&,unsigned_short&,jsoncons::semantic_tag&>
              ((vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
                *)&this->item_stack_,&this->name_,(unsigned_long *)&local_20,(half_arg_t *)&half_arg
               ,&local_22,&local_23);
  }
  else if (sVar1 == root_t) {
    local_20.common_.tag_ = tag;
    local_20.json_const_pointer_ = (json_const_reference_storage)6;
    local_20._4_4_ = SUB84(uVar2,4);
    local_20.half_float_.val_ = value;
    basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>::operator=
              (&this->result_,
               (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_> *)
               &local_20.common_);
    basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>::destroy
              ((basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_> *)
               &local_20.common_);
    this->is_valid_ = true;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_half(uint16_t value, 
        semantic_tag tag,   
        const ser_context&,
        std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, half_arg, value, tag);
                break;
            case structure_type::root_t:
                result_ = Json(half_arg, value, tag);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }